

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
ContractTestOnClassWithInvariant_ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled_Test
::TestBody(ContractTestOnClassWithInvariant_ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled_Test
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  undefined1 in_stack_fffffffffffffeff;
  AssertionResult *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char *in_stack_ffffffffffffff18;
  int line;
  char *in_stack_ffffffffffffff20;
  AssertionResult *this_02;
  Type in_stack_ffffffffffffff2c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff30;
  AssertionResult *this_03;
  int in_stack_ffffffffffffff4c;
  TestClassWithInvariant *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  AssertionResult *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar3;
  AssertionResult local_78;
  string local_68 [48];
  AssertionResult local_38 [3];
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      anon_unknown.dwarf_114b::TestClassWithInvariant::doubleX
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
  }
  else {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0x140844);
  }
  this_03 = local_38;
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               (char *)in_stack_ffffffffffffff68.ptr_,in_stack_ffffffffffffff60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    std::__cxx11::string::~string(local_68);
    testing::Message::~Message((Message *)0x14098c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140a04);
  uVar3 = 1;
  this_02 = &local_78;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff18,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_ffffffffffffff18 =
         testing::AssertionResult::failure_message((AssertionResult *)0x140aa6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,&this_02->success_,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff80),
               (Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
    testing::Message::~Message((Message *)0x140afa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140b4c);
  this_01 = (AssertionResult *)&stack0xffffffffffffff60;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff18,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(int *)this_01,
             (int *)in_stack_ffffffffffffff00);
  line = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_03);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x140bdf)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff80),
               (Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x140c2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x140c79);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithInvariant, ThatACallToAFailingPostConditionFireTheSetExceptionAndThatTheInvariantWasCalled)
{
  EXPECT_NO_THROW(sut.doubleX(2));
  EXPECT_TRUE(postConditionHasFailedFlag);

  EXPECT_EQ(1, sut.invariantWasCalled);
  EXPECT_EQ(1, sut.postConditionWasCalled);
}